

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

UVec3 __thiscall
vkt::image::anon_unknown_0::getLocalWorkGroupSize
          (anon_unknown_0 *this,ImageType imageType,UVec3 *imageSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint y;
  uint extraout_EDX;
  UVec3 UVar4;
  undefined1 local_2c [8];
  UVec3 computeGridSize;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  UVec3 *localWorkGroupSize;
  
  computeGridSize.m_data._4_8_ = imageSize;
  getShaderGridSize((image *)local_2c,imageType,imageSize);
  uVar1 = tcu::Vector<unsigned_int,_3>::x
                    ((Vector<unsigned_int,_3> *)
                     image::(anonymous_namespace)::g_localWorkGroupSizeBase);
  uVar2 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_2c);
  uVar1 = de::min<unsigned_int>(uVar1,uVar2);
  uVar2 = tcu::Vector<unsigned_int,_3>::y
                    ((Vector<unsigned_int,_3> *)
                     image::(anonymous_namespace)::g_localWorkGroupSizeBase);
  uVar3 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_2c);
  uVar2 = de::min<unsigned_int>(uVar2,uVar3);
  uVar3 = tcu::Vector<unsigned_int,_3>::z
                    ((Vector<unsigned_int,_3> *)
                     image::(anonymous_namespace)::g_localWorkGroupSizeBase);
  y = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_2c);
  uVar3 = de::min<unsigned_int>(uVar3,y);
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,uVar2,uVar3);
  UVar4.m_data[2] = extraout_EDX;
  UVar4.m_data._0_8_ = this;
  return (UVec3)UVar4.m_data;
}

Assistant:

const tcu::UVec3 getLocalWorkGroupSize (const ImageType imageType, const tcu::UVec3& imageSize)
{
	const tcu::UVec3 computeGridSize	= getShaderGridSize(imageType, imageSize);

	const tcu::UVec3 localWorkGroupSize = tcu::UVec3(de::min(g_localWorkGroupSizeBase.x(), computeGridSize.x()),
													 de::min(g_localWorkGroupSizeBase.y(), computeGridSize.y()),
													 de::min(g_localWorkGroupSizeBase.z(), computeGridSize.z()));
	return localWorkGroupSize;
}